

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O2

bool dxil_spv::emit_atomic_binop_instruction(Impl *impl,CallInst *instruction)

{
  StorageClass storage;
  Op op;
  Builder *this;
  Id IVar1;
  RawWidth width;
  Id type_id;
  Value *pVVar2;
  mapped_type *meta;
  Constant *this_00;
  APInt *this_01;
  uint64_t uVar3;
  Type *pTVar4;
  BufferAccessInfo BVar5;
  Operation *this_02;
  ComponentType component_type_00;
  uint32_t i;
  ulong uVar6;
  bool bVar7;
  ComponentType component_type;
  uint32_t num_coords_full;
  uint32_t num_coords;
  Id image_id;
  Builder *local_50;
  uint local_44;
  Id coords [3];
  
  local_50 = Converter::Impl::builder(impl);
  pVVar2 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  image_id = Converter::Impl::get_id_for_value(impl,pVVar2,0);
  meta = std::__detail::
         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&impl->handle_to_resource_meta,&image_id);
  pVVar2 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
  this_00 = &LLVMBC::cast<LLVMBC::ConstantInt>(pVVar2)->super_Constant;
  this_01 = LLVMBC::Constant::getUniqueInteger(this_00);
  uVar3 = LLVMBC::APInt::getZExtValue(this_01);
  emit_buffer_synchronization_validation(impl,instruction,AtomicRMW);
  coords[2] = 0;
  coords[0] = 0;
  coords[1] = 0;
  num_coords_full = 0;
  num_coords = 0;
  if ((byte)(meta->kind - TypedBuffer) < 3) {
    IVar1 = meta->index_offset_id;
    pTVar4 = LLVMBC::Value::getType((Value *)instruction);
    BVar5 = build_buffer_access(impl,instruction,1,IVar1,pTVar4,1);
    coords[0] = BVar5.index_id;
    num_coords_full = 1;
    num_coords = 1;
  }
  else {
    bVar7 = get_image_dimensions(impl,image_id,&num_coords_full,&num_coords);
    if (3 < num_coords_full || !bVar7) {
      return false;
    }
    for (uVar6 = 0; uVar6 < num_coords_full; uVar6 = uVar6 + 1) {
      pVVar2 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(int)uVar6 + 3);
      IVar1 = Converter::Impl::get_id_for_value(impl,pVVar2,0);
      coords[uVar6] = IVar1;
    }
  }
  IVar1 = spv::Builder::makeUintType(local_50,0x20);
  IVar1 = Converter::Impl::build_vector(impl,IVar1,coords,num_coords_full);
  storage = meta->storage;
  pTVar4 = LLVMBC::Value::getType((Value *)instruction);
  width = get_buffer_access_bits_per_component(impl,storage,pTVar4);
  if (width == B64) {
    spv::Builder::addCapability(local_50,CapabilityInt64Atomics);
  }
  IVar1 = emit_atomic_access_chain(impl,meta,width,image_id,IVar1,&component_type);
  if (meta->non_uniform == true) {
    spv::Builder::addDecoration(local_50,IVar1,DecorationNonUniform,-1);
  }
  bVar7 = (byte)uVar3 < 9;
  if (bVar7) {
    op = *(Op *)(&DAT_001a5878 + (ulong)((uint)uVar3 & 0xf) * 4);
    local_44 = (uint)component_type;
    type_id = Converter::Impl::get_type_id(impl,component_type,1,1,false);
    this_02 = Converter::Impl::allocate(impl,op,(Value *)instruction,type_id);
    Operation::add_id(this_02,IVar1);
    this = local_50;
    IVar1 = spv::Builder::makeUintConstant(local_50,1,false);
    Operation::add_id(this_02,IVar1);
    IVar1 = spv::Builder::makeUintConstant(this,0,false);
    Operation::add_id(this_02,IVar1);
    pVVar2 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,6);
    IVar1 = Converter::Impl::get_id_for_value(impl,pVVar2,0);
    component_type_00 = (ComponentType)local_44;
    IVar1 = Converter::Impl::fixup_store_type_atomic(impl,component_type_00,1,IVar1);
    Operation::add_id(this_02,IVar1);
    Converter::Impl::add(impl,this_02,meta->rov);
    Converter::Impl::fixup_load_type_atomic(impl,component_type_00,1,(Value *)instruction);
  }
  return bVar7;
}

Assistant:

bool emit_atomic_binop_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	const auto &meta = impl.handle_to_resource_meta[image_id];
	auto binop = static_cast<DXIL::AtomicBinOp>(
	    llvm::cast<llvm::ConstantInt>(instruction->getOperand(2))->getUniqueInteger().getZExtValue());

	emit_buffer_synchronization_validation(impl, instruction, BDAOperation::AtomicRMW);

	spv::Id coords[3] = {};
	uint32_t num_coords_full = 0, num_coords = 0;

	if (meta.kind == DXIL::ResourceKind::StructuredBuffer || meta.kind == DXIL::ResourceKind::RawBuffer ||
	    meta.kind == DXIL::ResourceKind::TypedBuffer)
	{
		auto access = build_buffer_access(impl, instruction, 1, meta.index_offset_id, instruction->getType(), 1);
		coords[0] = access.index_id;
		num_coords = 1;
		num_coords_full = 1;
	}
	else
	{
		if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
			return false;

		if (num_coords_full > 3)
			return false;

		for (uint32_t i = 0; i < num_coords_full; i++)
			coords[i] = impl.get_id_for_value(instruction->getOperand(3 + i));
	}
	spv::Id coord = impl.build_vector(builder.makeUintType(32), coords, num_coords_full);

	auto width = get_buffer_access_bits_per_component(impl, meta.storage, instruction->getType());
	if (width == RawWidth::B64)
		builder.addCapability(spv::CapabilityInt64Atomics);

	DXIL::ComponentType component_type;
	spv::Id counter_ptr_id = emit_atomic_access_chain(impl, meta, width, image_id, coord, component_type);

	if (meta.non_uniform)
		builder.addDecoration(counter_ptr_id, spv::DecorationNonUniformEXT);

	spv::Op opcode;

	switch (binop)
	{
	case DXIL::AtomicBinOp::Exchange:
		opcode = spv::OpAtomicExchange;
		break;

	case DXIL::AtomicBinOp::IAdd:
		opcode = spv::OpAtomicIAdd;
		break;

	case DXIL::AtomicBinOp::And:
		opcode = spv::OpAtomicAnd;
		break;

	case DXIL::AtomicBinOp::Or:
		opcode = spv::OpAtomicOr;
		break;

	case DXIL::AtomicBinOp::Xor:
		opcode = spv::OpAtomicXor;
		break;

	case DXIL::AtomicBinOp::IMin:
		opcode = spv::OpAtomicSMin;
		break;

	case DXIL::AtomicBinOp::IMax:
		opcode = spv::OpAtomicSMax;
		break;

	case DXIL::AtomicBinOp::UMin:
		opcode = spv::OpAtomicUMin;
		break;

	case DXIL::AtomicBinOp::UMax:
		opcode = spv::OpAtomicUMax;
		break;

	default:
		return false;
	}

	Operation *op = impl.allocate(opcode, instruction, impl.get_type_id(component_type, 1, 1));

	op->add_id(counter_ptr_id);
	op->add_id(builder.makeUintConstant(spv::ScopeDevice));
	op->add_id(builder.makeUintConstant(0));
	op->add_id(impl.fixup_store_type_atomic(component_type, 1, impl.get_id_for_value(instruction->getOperand(6))));

	impl.add(op, meta.rov);

	impl.fixup_load_type_atomic(component_type, 1, instruction);
	return true;
}